

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O3

void sph_solve<CRC32x8>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *keywords)

{
  char *pcVar1;
  undefined1 uVar2;
  ulong uVar3;
  void *__s;
  long lVar4;
  result_type rVar5;
  KHType KVar6;
  pointer pbVar7;
  ulong uVar8;
  uint uVar9;
  pointer pbVar10;
  uint uVar11;
  value_type_conflict1 *__val;
  size_type __new_size;
  uint i;
  ulong uVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  permutedKeywords;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mixtable;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  CRC32x8 hasher;
  uniform_int_distribution<unsigned_long> udist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  CRC32x8 local_50;
  ulong local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  local_50.name = "CRC32x8";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_88);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,(long)mixersize);
  if (-1 < (long)permutesize) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_a0,(long)permutesize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_68,(long)permutesize);
  }
  uVar3 = (long)(keywords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(keywords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = uVar3 >> 5;
  __new_size = uVar12 & 0xffffffff;
  if (__new_size < (ulong)((long)uVar3 >> 4)) {
    do {
      if (permutesize == -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_a0,__new_size);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_68,__new_size);
      }
      __s = operator_new(0x100);
      memset(__s,0,0x100);
      lVar4 = 0;
      cVar13 = '\0';
      cVar14 = '\x01';
      cVar15 = '\x02';
      cVar16 = '\x03';
      cVar17 = '\x04';
      cVar18 = '\x05';
      cVar19 = '\x06';
      cVar20 = '\a';
      cVar21 = '\b';
      cVar22 = '\t';
      cVar23 = '\n';
      cVar24 = '\v';
      cVar25 = '\f';
      cVar26 = '\r';
      cVar27 = '\x0e';
      cVar28 = '\x0f';
      do {
        pcVar1 = (char *)((long)__s + lVar4);
        *pcVar1 = cVar13;
        pcVar1[1] = cVar14;
        pcVar1[2] = cVar15;
        pcVar1[3] = cVar16;
        pcVar1[4] = cVar17;
        pcVar1[5] = cVar18;
        pcVar1[6] = cVar19;
        pcVar1[7] = cVar20;
        pcVar1[8] = cVar21;
        pcVar1[9] = cVar22;
        pcVar1[10] = cVar23;
        pcVar1[0xb] = cVar24;
        pcVar1[0xc] = cVar25;
        pcVar1[0xd] = cVar26;
        pcVar1[0xe] = cVar27;
        pcVar1[0xf] = cVar28;
        lVar4 = lVar4 + 0x10;
        cVar13 = cVar13 + '\x10';
        cVar14 = cVar14 + '\x10';
        cVar15 = cVar15 + '\x10';
        cVar16 = cVar16 + '\x10';
        cVar17 = cVar17 + '\x10';
        cVar18 = cVar18 + '\x10';
        cVar19 = cVar19 + '\x10';
        cVar20 = cVar20 + '\x10';
        cVar21 = cVar21 + '\x10';
        cVar22 = cVar22 + '\x10';
        cVar23 = cVar23 + '\x10';
        cVar24 = cVar24 + '\x10';
        cVar25 = cVar25 + '\x10';
        cVar26 = cVar26 + '\x10';
        cVar27 = cVar27 + '\x10';
        cVar28 = cVar28 + '\x10';
      } while (lVar4 != 0x100);
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xff;
      if (maxiter != 0) {
        uVar11 = 0;
        local_48 = uVar12;
        do {
          lVar4 = 0;
          do {
            rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                              (&local_40,&rng,&local_40._M_param);
            uVar2 = *(undefined1 *)((long)__s + lVar4);
            *(undefined1 *)((long)__s + lVar4) = *(undefined1 *)((long)__s + rVar5);
            *(undefined1 *)((long)__s + rVar5) = uVar2;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x100);
          if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar9 = 1;
            uVar12 = 0;
            do {
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] = *(uchar *)((long)__s + uVar12);
              uVar12 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar12 < (ulong)((long)local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
          }
          if (local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar9 = 1;
            uVar12 = 0;
            do {
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] = 0;
              local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_string_length = 0;
              *local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p = '\0';
              uVar12 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar12 < (ulong)((long)local_a0.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_a0.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pbVar10 = (keywords->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar7 = (keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_6c = uVar11;
          if (pbVar7 == pbVar10) {
            uVar3 = 0;
            pbVar10 = pbVar7;
          }
          else {
            uVar11 = 1;
            uVar3 = 0;
            do {
              KVar6 = CRC32x8::operator()(&local_50,pbVar10 + uVar3,&local_88,
                                          (long)local_a0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_a0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar12 = (ulong)(uint)((int)((ulong)KVar6 & 0xff) << 5);
              if (*(long *)((long)&(local_a0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                           uVar12) != 0) {
                pbVar7 = (keywords->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                pbVar10 = (keywords->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                break;
              }
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)KVar6 & 0xff] = KVar6.hash;
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&((local_a0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         uVar12));
              uVar3 = (ulong)uVar11;
              pbVar10 = (keywords->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pbVar7 = (keywords->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              uVar11 = uVar11 + 1;
            } while (uVar3 < (ulong)((long)pbVar7 - (long)pbVar10 >> 5));
          }
          uVar8 = (long)pbVar7 - (long)pbVar10 >> 5;
          uVar11 = local_6c + 1;
        } while ((uVar11 < (uint)maxiter) && (uVar8 != uVar3));
        uVar12 = local_48;
        if (uVar8 == uVar3) {
          printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n",
                 local_50.name,
                 (long)(keywords->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(keywords->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5,
                 (long)local_a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,(ulong)uVar11);
          sph_soln<CRC32x8>(keywords,&local_88,&local_a0,&local_68);
          operator_delete(__s,0x100);
          goto LAB_001030c2;
        }
      }
      operator_delete(__s,0x100);
      __new_size = (size_type)((int)uVar12 + 1);
      uVar12 = __new_size;
    } while (__new_size <
             (ulong)((long)(keywords->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(keywords->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  puts("Failure!");
LAB_001030c2:
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

void sph_solve(vector<string> &keywords)
{
    T hasher;
    vector<string> permutedKeywords(keywords.size());
    vector<typename T::Hash> hashes(keywords.size());
    vector<typename T::Key> mixtable;
    uint keysize = 1 << (sizeof(typename T::Key) * 8);

    mixtable.resize(mixersize); // must be ^2 and <= keysize

    uint iterations = 0;

    if (permutesize > -1)
    {
        permutedKeywords.resize(permutesize);
        hashes.resize(permutesize);
    }

    for(uint i = keywords.size(); i < keywords.size() * 2; i++)
    {
        if (permutesize == -1)
        {
            // if there are collisions, try a progressively larger keyword table
            permutedKeywords.resize(i);
            hashes.resize(i);
        }
        vector<typename T::Key> srcTable(keysize );
        for(uint c = 0; c < keysize; c++ )
            srcTable[ c ] = c;

        std::uniform_int_distribution<rng_type::result_type> udist(0, srcTable.size() -1);

        // mixtable retry loop...
        bool collision = true; // default assumption
        iterations = 0;
        while((iterations < maxiter) && collision)
        {
            // permute the srcTable and build mixtable and clear the hash stats
            for( uint i = 0; i < srcTable.size(); i++ )
                std::swap(srcTable[i], srcTable[ udist(rng) ]);
            for( uint i = 0; i < mixtable.size(); i++ )
                mixtable[i] = srcTable[i];
            for( uint pk = 0; pk < permutedKeywords.size(); pk++ )
            { hashes[pk] = 0; permutedKeywords[pk].clear(); }

            // trial hash all keywords. check for collisions
            uint k = 0;
            for( k = 0; k < keywords.size(); k++ )
            {
                auto kh = hasher(keywords[k], mixtable, permutedKeywords.size());
                if( permutedKeywords[ kh.key ].length() > 0 )
                    break; // collision
                hashes[ kh.key ] = kh.hash;
                permutedKeywords[ kh.key ] = keywords[ k ];
            }
            if( k == keywords.size() )
                collision = false; // no collisions
            iterations++;
        }
        if (!collision)
        {
            printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n", hasher.name, keywords.size(), permutedKeywords.size(), iterations);
            sph_soln<T>(keywords, mixtable, permutedKeywords, hashes);
            return;
        }
    }
    printf("Failure!\n");
}